

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

Fl_Shared_Image * __thiscall Fl_Help_View::get_image(Fl_Help_View *this,char *name,int W,int H)

{
  int iVar1;
  char *pcVar2;
  Fl_Help_View *local_1048;
  Fl_Shared_Image *ip;
  char *tempptr;
  char temp [2048];
  char dir [2048];
  char **local_30;
  char *localname;
  int H_local;
  int W_local;
  char *name_local;
  Fl_Help_View *this_local;
  
  pcVar2 = strchr(this->directory_,0x3a);
  if ((pcVar2 == (char *)0x0) || (pcVar2 = strchr(name,0x3a), pcVar2 != (char *)0x0)) {
    if ((*name == '/') || (pcVar2 = strchr(name,0x3a), pcVar2 != (char *)0x0)) {
      local_30 = (char **)name;
      if (this->link_ != (Fl_Help_Func *)0x0) {
        local_30 = (char **)(*this->link_)((Fl_Widget *)this,name);
      }
    }
    else {
      if (this->directory_[0] == '\0') {
        fl_getcwd(temp + 0x7f8,0x800);
        snprintf((char *)&tempptr,0x800,"file:%s/%s",temp + 0x7f8,name);
      }
      else {
        snprintf((char *)&tempptr,0x800,"%s/%s",this->directory_,name);
      }
      if (this->link_ == (Fl_Help_Func *)0x0) {
        local_30 = &tempptr;
      }
      else {
        local_30 = (char **)(*this->link_)((Fl_Widget *)this,(char *)&tempptr);
      }
    }
  }
  else {
    if (*name == '/') {
      fl_strlcpy((char *)&tempptr,this->directory_,0x800);
      pcVar2 = strchr(this->directory_,0x3a);
      pcVar2 = strrchr(pcVar2 + 3,0x2f);
      if (pcVar2 == (char *)0x0) {
        fl_strlcat((char *)&tempptr,name,0x800);
      }
      else {
        fl_strlcpy(pcVar2,name,0x800 - ((long)pcVar2 - (long)&tempptr));
      }
    }
    else {
      snprintf((char *)&tempptr,0x800,"%s/%s",this->directory_,name);
    }
    if (this->link_ == (Fl_Help_Func *)0x0) {
      local_30 = &tempptr;
    }
    else {
      local_30 = (char **)(*this->link_)((Fl_Widget *)this,(char *)&tempptr);
    }
  }
  if (local_30 == (char **)0x0) {
    this_local = (Fl_Help_View *)0x0;
  }
  else {
    iVar1 = strncmp((char *)local_30,"file:",5);
    if (iVar1 == 0) {
      local_30 = (char **)((long)local_30 + 5);
    }
    if (initial_load == '\0') {
      local_1048 = (Fl_Help_View *)Fl_Shared_Image::find((char *)local_30,W,H);
      if (local_1048 == (Fl_Help_View *)0x0) {
        local_1048 = (Fl_Help_View *)&broken_image;
      }
      else {
        Fl_Shared_Image::release((Fl_Shared_Image *)local_1048);
      }
    }
    else {
      local_1048 = (Fl_Help_View *)Fl_Shared_Image::get((char *)local_30,W,H);
      if (local_1048 == (Fl_Help_View *)0x0) {
        local_1048 = (Fl_Help_View *)&broken_image;
      }
    }
    this_local = local_1048;
  }
  return (Fl_Shared_Image *)this_local;
}

Assistant:

Fl_Shared_Image *
Fl_Help_View::get_image(const char *name, int W, int H) {
  const char	*localname;		// Local filename
  char		dir[FL_PATH_MAX];	// Current directory
  char		temp[FL_PATH_MAX],	// Temporary filename
		*tempptr;		// Pointer into temporary name
  Fl_Shared_Image *ip;			// Image pointer...

  // See if the image can be found...
  if (strchr(directory_, ':') != NULL && strchr(name, ':') == NULL) {
    if (name[0] == '/') {
      strlcpy(temp, directory_, sizeof(temp));

      if ((tempptr = strrchr(strchr(directory_, ':') + 3, '/')) != NULL) {
        strlcpy(tempptr, name, sizeof(temp) - (tempptr - temp));
      } else {
        strlcat(temp, name, sizeof(temp));
      }
    } else {
      snprintf(temp, sizeof(temp), "%s/%s", directory_, name);
    }

    if (link_) localname = (*link_)(this, temp);
    else localname = temp;
  } else if (name[0] != '/' && strchr(name, ':') == NULL) {
    if (directory_[0]) snprintf(temp, sizeof(temp), "%s/%s", directory_, name);
    else {
      fl_getcwd(dir, sizeof(dir));
      snprintf(temp, sizeof(temp), "file:%s/%s", dir, name);
    }

    if (link_) localname = (*link_)(this, temp);
    else localname = temp;
  } else if (link_) localname = (*link_)(this, name);
  else localname = name;

  if (!localname) return 0;

  if (strncmp(localname, "file:", 5) == 0) localname += 5;

  if (initial_load) {
    if ((ip = Fl_Shared_Image::get(localname, W, H)) == NULL) {
      ip = (Fl_Shared_Image *)&broken_image;
    }
  } else { // draw or resize
    if ((ip = Fl_Shared_Image::find(localname, W, H)) == NULL) {
      ip = (Fl_Shared_Image *)&broken_image;
    } else {
      ip->release();
    }
  }

  return ip;
}